

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnGenericCustomSection
          (BinaryReaderIR *this,string_view name,void *data,Offset size)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  size_t sVar2;
  Custom local_88;
  
  __s = this->filename_;
  sVar2 = strlen(__s);
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,name._M_str,name._M_str + name._M_len);
  local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.loc.field_1._8_8_ = 0;
  local_88.loc.filename._M_len = sVar2;
  local_88.loc.filename._M_str = __s;
  local_88.loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88.data,size);
  if (size != 0) {
    memcpy(local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,data,size);
  }
  std::vector<wabt::Custom,_std::allocator<wabt::Custom>_>::emplace_back<wabt::Custom>
            (&this->module_->customs,&local_88);
  if (local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
    operator_delete(local_88.name._M_dataplus._M_p,local_88.name.field_2._M_allocated_capacity + 1);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnGenericCustomSection(std::string_view name,
                                              const void* data,
                                              Offset size) {
  Custom custom = Custom(GetLocation(), name);
  custom.data.resize(size);
  if (size > 0) {
    memcpy(custom.data.data(), data, size);
  }
  module_->customs.push_back(std::move(custom));
  return Result::Ok;
}